

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O1

void vlogprintf(char *fmt,__va_list_tag *ap)

{
  va_list lfap;
  undefined8 local_28;
  void *pvStack_20;
  void *local_18;
  
  local_18 = ap->reg_save_area;
  local_28._0_4_ = ap->gp_offset;
  local_28._4_4_ = ap->fp_offset;
  pvStack_20 = ap->overflow_arg_area;
  if (log_console != L'\0') {
    vfprintf(_stdout,fmt,ap);
  }
  if (logfile != (FILE *)0x0) {
    vfprintf((FILE *)logfile,fmt,&local_28);
  }
  return;
}

Assistant:

static void __LA_PRINTFLIKE(1, 0)
vlogprintf(const char *fmt, va_list ap)
{
#ifdef va_copy
	va_list lfap;
	va_copy(lfap, ap);
#endif
	if (log_console)
		vfprintf(stdout, fmt, ap);
	if (logfile != NULL)
#ifdef va_copy
		vfprintf(logfile, fmt, lfap);
	va_end(lfap);
#else
		vfprintf(logfile, fmt, ap);
#endif
}